

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hwl.hpp
# Opt level: O1

bool hwl::statement(state *ps,Statement *psVal)

{
  bool bVar1;
  Statement ***pppSVar2;
  Statement **ppSVar3;
  code **ppcVar4;
  long lVar5;
  _Any_data _Stack_158;
  code *local_148;
  code *local_140;
  Statement **local_138;
  undefined8 uStack_130;
  code *local_128;
  code *pcStack_120;
  _Any_data local_118;
  code *local_108;
  code *pcStack_100;
  Statement *local_f8;
  code *pcStack_f0;
  code *local_e8;
  code *pcStack_e0;
  Statement *local_d8;
  code *pcStack_d0;
  Statement *local_c8;
  code *pcStack_c0;
  Statement *local_b8;
  undefined8 uStack_b0;
  code *local_a8;
  code *pcStack_a0;
  code *local_98;
  undefined8 uStack_90;
  code *local_88 [2];
  Statement ***local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  code *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  Statement **local_38;
  undefined8 uStack_30;
  Statement **local_28;
  code *pcStack_20;
  
  local_138 = &local_b8;
  uStack_b0 = 0;
  local_b8 = (Statement *)indent;
  pcStack_a0 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke;
  local_a8 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_manager;
  uStack_90 = 0;
  local_98 = dedent;
  local_88[1] = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke
  ;
  local_88[0] = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::
                _M_manager;
  local_78 = &local_138;
  uStack_130 = 2;
  pcStack_120 = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
                ::_M_invoke;
  local_128 = std::
              _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
              ::_M_manager;
  local_118._M_unused._M_object = local_88 + 2;
  uStack_70 = 0;
  pcStack_60 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:731:10)>
             ::_M_manager;
  uStack_50 = 0;
  local_58 = _;
  pcStack_40 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_invoke;
  local_48 = std::_Function_handler<bool_(parser::state_&),_bool_(*)(parser::state_&)>::_M_manager;
  local_38 = &local_f8;
  pcStack_f0 = call;
  pcStack_e0 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
               ::_M_invoke;
  local_e8 = std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
             ::_M_manager;
  pcStack_d0 = if_stmt;
  pcStack_c0 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
               ::_M_invoke;
  local_c8 = (Statement *)
             std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:741:10)>
             ::_M_manager;
  uStack_30 = 2;
  pcStack_20 = std::
               _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
               ::_M_invoke;
  local_28 = (Statement **)
             std::
             _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:685:10)>
             ::_M_manager;
  local_118._8_8_ = 3;
  pcStack_100 = std::
                _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
                ::_M_invoke;
  local_108 = std::
              _Function_handler<bool_(parser::state_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mrzv[P]henson/include/henson/parser.hpp:674:10)>
              ::_M_manager;
  local_f8 = psVal;
  local_d8 = psVal;
  parser::memoize<hwl::Statement>((combinator *)&_Stack_158,7,psVal,(combinator *)&local_118);
  if (local_148 != (code *)0x0) {
    bVar1 = (*local_140)(&_Stack_158,ps);
    if (local_148 != (code *)0x0) {
      (*local_148)(&_Stack_158,&_Stack_158,__destroy_functor);
    }
    if (local_108 != (code *)0x0) {
      (*local_108)(&local_118,&local_118,__destroy_functor);
    }
    lVar5 = -0x60;
    pppSVar2 = &local_38;
    do {
      if (pppSVar2[2] != (Statement **)0x0) {
        (*(code *)pppSVar2[2])(pppSVar2,pppSVar2,3);
      }
      pppSVar2 = pppSVar2 + -4;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0);
    lVar5 = -0x40;
    ppSVar3 = &local_d8;
    do {
      if (ppSVar3[2] != (Statement *)0x0) {
        (*(code *)ppSVar3[2])(ppSVar3,ppSVar3,3);
      }
      ppSVar3 = ppSVar3 + -4;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0);
    if (local_128 != (code *)0x0) {
      (*local_128)(&local_138,&local_138,3);
    }
    lVar5 = -0x40;
    ppcVar4 = &local_98;
    do {
      if (ppcVar4[2] != (code *)0x0) {
        (*ppcVar4[2])(ppcVar4,ppcVar4,3);
      }
      ppcVar4 = ppcVar4 + -4;
      lVar5 = lVar5 + 0x20;
    } while (lVar5 != 0);
    return bVar1;
  }
  std::__throw_bad_function_call();
}

Assistant:

bool statement(parser::state& ps, Statement                & psVal) {
		return parser::memoize(7, psVal, 
			parser::sequence({
				parser::look_not(
					parser::choice({
						indent,
						dedent})),
				_,
				
					parser::choice({
						parser::bind(psVal, call),
						parser::bind(psVal, if_stmt)})}))(ps);
	}